

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<const_DomActionGroup_*,_QString>::emplace_helper<QString>
          (QHash<const_DomActionGroup_*,_QString> *this,DomActionGroup **key,QString *args)

{
  long lVar1;
  piter it;
  piter pVar2;
  iterator<QHashPrivate::Node<const_DomActionGroup_*,_QString>_> *in_RDX;
  Data<QHashPrivate::Node<const_DomActionGroup_*,_QString>_> *in_RSI;
  long in_FS_OFFSET;
  InsertionResult result;
  iterator *in_stack_ffffffffffffff88;
  Data<QHashPrivate::Node<const_DomActionGroup_*,_QString>_> *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashPrivate::Data<QHashPrivate::Node<DomActionGroup_const*,QString>>::
  findOrInsert<DomActionGroup_const*>(in_RSI,(DomActionGroup **)in_RDX);
  QHashPrivate::iterator<QHashPrivate::Node<const_DomActionGroup_*,_QString>_>::node(in_RDX);
  QHashPrivate::Node<const_DomActionGroup_*,_QString>::createInPlace<QString>
            ((Node<const_DomActionGroup_*,_QString> *)in_stack_ffffffffffffff90,
             (DomActionGroup **)in_stack_ffffffffffffff88,(QString *)0x181b73);
  it.bucket = in_stack_ffffffffffffff98;
  it.d = in_stack_ffffffffffffff90;
  iterator::iterator(in_stack_ffffffffffffff88,it);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar2.bucket = local_28;
  pVar2.d = local_30;
  return (iterator)pVar2;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }